

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenArrayGetSetRef(BinaryenExpressionRef expr,BinaryenExpressionRef refExpr)

{
  if (expr->_id != ArrayGetId) {
    __assert_fail("expression->is<ArrayGet>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x1105,
                  "void BinaryenArrayGetSetRef(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (refExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 1) = refExpr;
    return;
  }
  __assert_fail("refExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x1106,"void BinaryenArrayGetSetRef(BinaryenExpressionRef, BinaryenExpressionRef)")
  ;
}

Assistant:

void BinaryenArrayGetSetRef(BinaryenExpressionRef expr,
                            BinaryenExpressionRef refExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<ArrayGet>());
  assert(refExpr);
  static_cast<ArrayGet*>(expression)->ref = (Expression*)refExpr;
}